

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O2

void INT_CMreturn_buffer(CManager_conflict cm,void *data)

{
  FILE *__stream;
  int iVar1;
  __pid_t _Var2;
  CMbuffer cmb;
  pthread_t pVar3;
  timespec ts;
  
  cmb = cm_buffer_lookup(cm,data);
  if (cmb == (CMbuffer)0x0) {
    fprintf(_stderr,"Error: INT_CMreturn_buffer called with record %p not associated with cm\n",data
           );
    cm_buffer_dump_list(cm);
    return;
  }
  iVar1 = CMtrace_val[9];
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar1 = CMtrace_init(cm,CMBufferVerbose);
  }
  if (iVar1 != 0) {
    if (CMtrace_PID != 0) {
      __stream = (FILE *)cm->CMTrace_file;
      _Var2 = getpid();
      pVar3 = pthread_self();
      fprintf(__stream,"P%lxT%lx - ",(long)_Var2,pVar3);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&ts);
      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
    }
    fprintf((FILE *)cm->CMTrace_file,
            "CMreturn_buffer, data %p found buffer %p, ref_count now %d, calling cm_return_data_buf\n"
            ,data,cmb,(ulong)(uint)cmb->ref_count);
  }
  fflush((FILE *)cm->CMTrace_file);
  cm_return_data_buf(cm,cmb);
  return;
}

Assistant:

extern void
 INT_CMreturn_buffer(CManager cm, void *data)
 {
     CMbuffer buf = cm_buffer_lookup(cm, data);
     if (buf == NULL) {
	 fprintf(stderr, "Error: INT_CMreturn_buffer called with record %p not associated with cm\n", data);
	 cm_buffer_dump_list(cm);
	 return;
     }
     CMtrace_out(cm, CMBufferVerbose, "CMreturn_buffer, data %p found buffer %p, ref_count now %d, calling cm_return_data_buf\n", data, buf, buf->ref_count);
     cm_return_data_buf(cm, buf);
 }